

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
slang::splitString(vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *__return_storage_ptr__,slang *this,string_view str,char delimiter)

{
  pointer *ppbVar1;
  iterator iVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  slang *psVar7;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  sVar5 = str._M_len;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar7 = (slang *)0x0;
  do {
    uVar6 = 0xffffffffffffffff;
    if (psVar7 <= this && (long)this - (long)psVar7 != 0) {
      pvVar3 = memchr(psVar7 + sVar5,(int)str._M_str,(long)this - (long)psVar7);
      uVar6 = -(ulong)(pvVar3 == (void *)0x0) | (long)pvVar3 - sVar5;
    }
    if (uVar6 == 0xffffffffffffffff) {
      sVar4 = (long)this - (long)psVar7;
      if (this < psVar7) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   psVar7,this);
      }
      local_40._M_str = (char *)(psVar7 + sVar5);
      iVar2._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      local_40._M_len = sVar4;
      if (iVar2._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)__return_storage_ptr__,iVar2,&local_40);
      }
      else {
        (iVar2._M_current)->_M_len = sVar4;
        (iVar2._M_current)->_M_str = local_40._M_str;
        ppbVar1 = &(__return_storage_ptr__->
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
    }
    else {
      if (this < psVar7) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   psVar7,this);
      }
      local_40._M_len = uVar6 - (long)psVar7;
      if ((ulong)((long)this - (long)psVar7) < uVar6 - (long)psVar7) {
        local_40._M_len = (long)this - (long)psVar7;
      }
      local_40._M_str = (char *)(psVar7 + sVar5);
      iVar2._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)__return_storage_ptr__,iVar2,&local_40);
      }
      else {
        (iVar2._M_current)->_M_len = local_40._M_len;
        (iVar2._M_current)->_M_str = local_40._M_str;
        ppbVar1 = &(__return_storage_ptr__->
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
      psVar7 = (slang *)(uVar6 + 1);
    }
  } while (uVar6 != 0xffffffffffffffff);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string_view> splitString(std::string_view str, char delimiter) {
    std::vector<std::string_view> result;
    std::string_view::size_type index = 0;
    while (true) {
        auto nextIndex = str.find(delimiter, index);
        if (nextIndex == std::string_view::npos) {
            result.push_back(str.substr(index));
            break;
        }

        result.push_back(str.substr(index, nextIndex - index));
        index = nextIndex + 1;
    }
    return result;
}